

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser.cc
# Opt level: O0

bool __thiscall ManifestParser::ParseFileInclude(ManifestParser *this,bool new_scope,string *err)

{
  bool bVar1;
  BindingEnv *this_00;
  undefined1 local_d0 [8];
  ManifestParser subparser;
  string path;
  undefined1 local_40 [8];
  EvalString eval;
  string *err_local;
  bool new_scope_local;
  ManifestParser *this_local;
  
  eval.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)err;
  EvalString::EvalString((EvalString *)local_40);
  bVar1 = Lexer::ReadPath(&(this->super_Parser).lexer_,(EvalString *)local_40,
                          &(eval.parsed_.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->first);
  if (bVar1) {
    EvalString::Evaluate_abi_cxx11_
              ((string *)&subparser.quiet_,(EvalString *)local_40,&this->env_->super_Env);
    ManifestParser((ManifestParser *)local_d0,(this->super_Parser).state_,
                   (this->super_Parser).file_reader_,this->options_);
    if (new_scope) {
      this_00 = (BindingEnv *)operator_new(0x70);
      BindingEnv::BindingEnv(this_00,this->env_);
      subparser.super_Parser.lexer_.last_token_ = (char *)this_00;
    }
    else {
      subparser.super_Parser.lexer_.last_token_ = (char *)this->env_;
    }
    bVar1 = Parser::Load((Parser *)local_d0,(string *)&subparser.quiet_,
                         &(eval.parsed_.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->first,
                         &(this->super_Parser).lexer_);
    if (bVar1) {
      bVar1 = Parser::ExpectToken(&this->super_Parser,NEWLINE,
                                  &(eval.parsed_.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->first);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
    std::__cxx11::string::~string((string *)&subparser.quiet_);
  }
  else {
    this_local._7_1_ = false;
  }
  EvalString::~EvalString((EvalString *)local_40);
  return this_local._7_1_;
}

Assistant:

bool ManifestParser::ParseFileInclude(bool new_scope, string* err) {
  EvalString eval;
  if (!lexer_.ReadPath(&eval, err))
    return false;
  string path = eval.Evaluate(env_);

  ManifestParser subparser(state_, file_reader_, options_);
  if (new_scope) {
    subparser.env_ = new BindingEnv(env_);
  } else {
    subparser.env_ = env_;
  }

  if (!subparser.Load(path, err, &lexer_))
    return false;

  if (!ExpectToken(Lexer::NEWLINE, err))
    return false;

  return true;
}